

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

LPCOLESTR __thiscall
Parser::GetFunctionName(Parser *this,ParseNodeFnc *pnodeFnc,LPCOLESTR pNameHint)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LPCOLESTR local_28;
  LPCOLESTR name;
  LPCOLESTR pNameHint_local;
  ParseNodeFnc *pnodeFnc_local;
  Parser *this_local;
  
  local_28 = (LPCOLESTR)0x0;
  if (pnodeFnc->pnodeName != (ParseNodeVar *)0x0) {
    if ((pnodeFnc->pnodeName->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1e3d,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                         "pnodeFnc->pnodeName->nop == knopVarDecl");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    local_28 = Ident::Psz(pnodeFnc->pnodeName->pid);
  }
  if ((local_28 == (LPCOLESTR)0x0) && (pNameHint != (LPCOLESTR)0x0)) {
    local_28 = pNameHint;
  }
  if ((local_28 == (LPCOLESTR)0x0) &&
     ((bVar2 = ParseNodeFnc::IsLambda(pnodeFnc), bVar2 ||
      ((bVar2 = ParseNodeFnc::IsDeclaration(pnodeFnc), !bVar2 &&
       (bVar2 = ParseNodeFnc::IsMethod(pnodeFnc), !bVar2)))))) {
    local_28 = L"Anonymous function";
  }
  if ((local_28 == (LPCOLESTR)0x0) && (this->m_functionBody != (ParseableFunctionInfo *)0x0)) {
    local_28 = Js::ParseableFunctionInfo::GetExternalDisplayName(this->m_functionBody);
  }
  else if (local_28 == (LPCOLESTR)0x0) {
    local_28 = L"Anonymous function";
  }
  return local_28;
}

Assistant:

LPCOLESTR Parser::GetFunctionName(ParseNodeFnc * pnodeFnc, LPCOLESTR pNameHint)
{
    LPCOLESTR name = nullptr;
    if (pnodeFnc->pnodeName != nullptr)
    {
        Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
        name = pnodeFnc->pnodeName->pid->Psz();
    }
    if (name == nullptr && pNameHint != nullptr)
    {
        name = pNameHint;
    }
    if (name == nullptr && (pnodeFnc->IsLambda() ||
        (!pnodeFnc->IsDeclaration() && !pnodeFnc->IsMethod())))
    {
        name = Js::Constants::AnonymousFunction;
    }
    if (name == nullptr && m_functionBody != nullptr)
    {
        name = m_functionBody->GetExternalDisplayName();
    }
    else if (name == nullptr)
    {
        name = Js::Constants::AnonymousFunction;
    }
    return name;
}